

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O3

int Bmc_ComputeCanonical(sat_solver *pSat,Vec_Int_t *vLits,Vec_Int_t *vTemp,int nBTLimit)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  
  if (vLits->nSize < 1) {
LAB_00510c1e:
    __assert_fail("status == l_True",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcClp.c"
                  ,0x268,"int Bmc_ComputeCanonical(sat_solver *, Vec_Int_t *, Vec_Int_t *, int)");
  }
  uVar8 = 0;
  lVar6 = 1;
  do {
    iVar7 = (int)uVar8;
    while( true ) {
      vTemp->nSize = 0;
      lVar5 = 0;
      do {
        if (vLits->nSize <= lVar5) goto LAB_00510bc1;
        Vec_IntPush(vTemp,vLits->pArray[lVar5]);
        lVar5 = lVar5 + 1;
      } while (lVar6 != lVar5);
      iVar3 = sat_solver_solve(pSat,vTemp->pArray,vTemp->pArray + vTemp->nSize,(long)nBTLimit,0,0,0)
      ;
      if (iVar3 == 0) {
        return 0;
      }
      if (iVar3 == 1) break;
      if (vLits->nSize <= iVar7) {
LAB_00510bc1:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar2 = vLits->pArray;
      uVar1 = piVar2[uVar8];
      if ((int)uVar1 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10d,"int Abc_LitIsCompl(int)");
      }
      if ((uVar1 & 1) == 0) {
        return -1;
      }
      piVar2[uVar8] = uVar1 & 0x7ffffffe;
      iVar4 = vLits->nSize;
      lVar5 = uVar8 + 1;
      if (iVar7 + 1 < iVar4) {
        do {
          if (piVar2[lVar5] < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                          ,0x110,"int Abc_LitRegular(int)");
          }
          piVar2[lVar5] = piVar2[lVar5] | 1;
          lVar5 = lVar5 + 1;
          iVar4 = vLits->nSize;
        } while ((int)lVar5 < iVar4);
      }
      if (iVar4 <= iVar7) {
        if (iVar3 == 1) {
          return 1;
        }
        goto LAB_00510c1e;
      }
    }
    lVar6 = lVar6 + 1;
    uVar8 = (ulong)(iVar7 + 1U);
    if (vLits->nSize <= (int)(iVar7 + 1U)) {
      return 1;
    }
  } while( true );
}

Assistant:

int Bmc_ComputeCanonical( sat_solver * pSat, Vec_Int_t * vLits, Vec_Int_t * vTemp, int nBTLimit )
{
    int i, k, iLit, status = l_Undef;
    for ( i = 0; i < Vec_IntSize(vLits); i++ )
    {
        // copy the first i+1 literals
        Vec_IntClear( vTemp );
        Vec_IntForEachEntryStop( vLits, iLit, k, i+1 )
            Vec_IntPush( vTemp, iLit );
        // check if it satisfies the on-set
        status = sat_solver_solve( pSat, Vec_IntArray(vTemp), Vec_IntLimit(vTemp), nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            return l_Undef;
        if ( status == l_True )
            continue;
        // if it is UNSAT, try the opposite literal
        iLit = Vec_IntEntry( vLits, i );
        // if literal is positive, there is no way to flip it
        if ( !Abc_LitIsCompl(iLit) )
            return l_False;
        Vec_IntWriteEntry( vLits, i, Abc_LitNot(iLit) );
        Vec_IntForEachEntryStart( vLits, iLit, k, i+1 )
            Vec_IntWriteEntry( vLits, k, Abc_LitNot(Abc_LitRegular(iLit)) );
        // recheck
        i--;
    }
    assert( status == l_True );
    return status;
}